

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

void __thiscall
ON_ComponentManifestItem::ON_ComponentManifestItem
          (ON_ComponentManifestItem *this,ON_ModelComponent *component,ON_UUID *manifest_id,
          ON_NameHash *manifest_name_hash)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  uint uVar4;
  ON__UINT32 OVar5;
  ON__UINT8 OVar6;
  ON__UINT8 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  Type TVar10;
  ON__UINT64 OVar11;
  
  this->m_status_bits = 0;
  TVar10 = ON_ModelComponent::ComponentType(component);
  this->m_component_type = TVar10;
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  this->m_reserved3 = 0;
  this->m_index = -0x7fffffff;
  OVar11 = ON_ModelComponent::RuntimeSerialNumber(component);
  this->m_component_runtime_serial_number = OVar11;
  uVar2 = manifest_id->Data2;
  uVar3 = manifest_id->Data3;
  uVar1 = *(undefined8 *)manifest_id->Data4;
  (this->m_id).Data1 = manifest_id->Data1;
  (this->m_id).Data2 = uVar2;
  (this->m_id).Data3 = uVar3;
  *(undefined8 *)(this->m_id).Data4 = uVar1;
  *(undefined8 *)(this->m_name_hash).m_parent_id.Data4 =
       *(undefined8 *)(manifest_name_hash->m_parent_id).Data4;
  OVar5 = manifest_name_hash->m_flags;
  OVar6 = (manifest_name_hash->m_sha1_hash).m_digest[0];
  OVar7 = (manifest_name_hash->m_sha1_hash).m_digest[1];
  OVar8 = (manifest_name_hash->m_sha1_hash).m_digest[2];
  OVar9 = (manifest_name_hash->m_sha1_hash).m_digest[3];
  uVar1 = *(undefined8 *)((manifest_name_hash->m_sha1_hash).m_digest + 4);
  uVar4 = (manifest_name_hash->m_parent_id).Data1;
  uVar2 = (manifest_name_hash->m_parent_id).Data2;
  uVar3 = (manifest_name_hash->m_parent_id).Data3;
  *(undefined8 *)((this->m_name_hash).m_sha1_hash.m_digest + 0xc) =
       *(undefined8 *)((manifest_name_hash->m_sha1_hash).m_digest + 0xc);
  (this->m_name_hash).m_parent_id.Data1 = uVar4;
  (this->m_name_hash).m_parent_id.Data2 = uVar2;
  (this->m_name_hash).m_parent_id.Data3 = uVar3;
  (this->m_name_hash).m_flags = OVar5;
  (this->m_name_hash).m_sha1_hash.m_digest[0] = OVar6;
  (this->m_name_hash).m_sha1_hash.m_digest[1] = OVar7;
  (this->m_name_hash).m_sha1_hash.m_digest[2] = OVar8;
  (this->m_name_hash).m_sha1_hash.m_digest[3] = OVar9;
  *(undefined8 *)((this->m_name_hash).m_sha1_hash.m_digest + 4) = uVar1;
  return;
}

Assistant:

ON_ComponentManifestItem::ON_ComponentManifestItem(
  const class ON_ModelComponent& component,
  const ON_UUID& manifest_id,
  const class ON_NameHash& manifest_name_hash
  )
  : m_component_type(component.ComponentType())
  , m_component_runtime_serial_number(component.RuntimeSerialNumber())
  , m_id(manifest_id)
  , m_name_hash(manifest_name_hash)
{}